

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O0

void __thiscall QOffscreenSurface::destroy(QOffscreenSurface *this)

{
  QOffscreenSurfacePrivate *pQVar1;
  QWindow *in_RDI;
  long in_FS_OFFSET;
  QOffscreenSurfacePrivate *d;
  QPlatformSurfaceEvent e;
  undefined8 in_stack_ffffffffffffffb8;
  SurfaceEventType surfaceEventType;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  surfaceEventType = (SurfaceEventType)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QOffscreenSurface *)0x3aca1a);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPlatformSurfaceEvent::QPlatformSurfaceEvent((QPlatformSurfaceEvent *)in_RDI,surfaceEventType);
  QCoreApplication::sendEvent((QObject *)in_RDI,(QEvent *)&local_20);
  if (pQVar1->platformOffscreenSurface != (QPlatformOffscreenSurface *)0x0) {
    (*(pQVar1->platformOffscreenSurface->super_QPlatformSurface)._vptr_QPlatformSurface[1])();
  }
  pQVar1->platformOffscreenSurface = (QPlatformOffscreenSurface *)0x0;
  if (pQVar1->offscreenWindow != (QWindow *)0x0) {
    QWindow::destroy(in_RDI);
    if (pQVar1->offscreenWindow != (QWindow *)0x0) {
      (**(code **)(*(long *)pQVar1->offscreenWindow + 0x20))();
    }
    pQVar1->offscreenWindow = (QWindow *)0x0;
  }
  QPlatformSurfaceEvent::~QPlatformSurfaceEvent((QPlatformSurfaceEvent *)0x3acaed);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOffscreenSurface::destroy()
{
    Q_D(QOffscreenSurface);

    QPlatformSurfaceEvent e(QPlatformSurfaceEvent::SurfaceAboutToBeDestroyed);
    QGuiApplication::sendEvent(this, &e);

    delete d->platformOffscreenSurface;
    d->platformOffscreenSurface = nullptr;
    if (d->offscreenWindow) {
        d->offscreenWindow->destroy();
        delete d->offscreenWindow;
        d->offscreenWindow = nullptr;
    }
}